

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  bool bVar1;
  char local_a9;
  string local_a8;
  reference local_88;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char local_51;
  undefined1 local_50 [8];
  string fullName;
  string *fileName_local;
  char *includeName_local;
  char *dir_local;
  cmFortranParser_s *this_local;
  
  fullName.field_2._8_8_ = fileName;
  fileName_local = (string *)includeName;
  includeName_local = dir;
  dir_local = (char *)this;
  bVar1 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,(char *)fileName_local);
    this_local._7_1_ = cmsys::SystemTools::FileExists((string *)fullName.field_2._8_8_,true);
  }
  else {
    local_51 = '/';
    cmStrCat<char_const*&,char,char_const*&>
              ((string *)local_50,&includeName_local,&local_51,(char **)&fileName_local);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_50,true);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,(string *)local_50);
      this_local._7_1_ = 1;
    }
    else {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->IncludePath);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->IncludePath);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&i);
        if (!bVar1) break;
        local_88 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
        local_a9 = '/';
        cmStrCat<std::__cxx11::string_const&,char,char_const*&>
                  (&local_a8,local_88,&local_a9,(char **)&fileName_local);
        std::__cxx11::string::operator=((string *)local_50,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_50,true);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)fullName.field_2._8_8_,(string *)local_50);
          this_local._7_1_ = 1;
          goto LAB_009733ae;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = 0;
    }
LAB_009733ae:
    std::__cxx11::string::~string((string *)local_50);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = cmStrCat(dir, '/', includeName);
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = cmStrCat(i, '/', includeName);
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}